

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdefl.h
# Opt level: O0

void sdefl_fnd(sdefl_match *m,sdefl *s,int chain_len,int max_match,uchar *in,int p)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int local_44;
  int local_38;
  int n;
  int limit;
  int i;
  int p_local;
  uchar *in_local;
  int max_match_local;
  int chain_len_local;
  sdefl *s_local;
  sdefl_match *m_local;
  
  uVar1 = sdefl_hash32(in + p);
  n = s->tbl[uVar1];
  in_local._4_4_ = chain_len;
  if (p + -0x8000 < -1) {
    local_44 = -1;
  }
  else {
    local_44 = p + -0x8000;
  }
  while( true ) {
    if (n <= local_44) {
      return;
    }
    if (in[n + m->len] == in[p + m->len]) {
      uVar1 = sdefl_uload32(in + n);
      uVar2 = sdefl_uload32(in + p);
      if (uVar1 == uVar2) {
        local_38 = 4;
        while( true ) {
          bVar3 = false;
          if (local_38 < max_match) {
            bVar3 = in[n + local_38] == in[p + local_38];
          }
          if (!bVar3) break;
          local_38 = local_38 + 1;
        }
        if (m->len < local_38) {
          m->len = local_38;
          m->off = p - n;
          if (local_38 == max_match) {
            return;
          }
        }
      }
    }
    in_local._4_4_ = in_local._4_4_ + -1;
    if (in_local._4_4_ == 0) break;
    n = s->prv[(int)(n & 0x7fff)];
  }
  return;
}

Assistant:

static void
sdefl_fnd(struct sdefl_match *m, const struct sdefl *s,
          int chain_len, int max_match, const unsigned char *in, int p) {
  int i = s->tbl[sdefl_hash32(&in[p])];
  int limit = ((p-SDEFL_WIN_SIZ)<SDEFL_NIL)?SDEFL_NIL:(p-SDEFL_WIN_SIZ);
  while (i > limit) {
    if (in[i+m->len] == in[p+m->len] &&
        (sdefl_uload32(&in[i]) == sdefl_uload32(&in[p]))){
      int n = SDEFL_MIN_MATCH;
      while (n < max_match && in[i+n] == in[p+n]) n++;
      if (n > m->len) {
        m->len = n, m->off = p - i;
        if (n == max_match) break;
      }
    }
    if (!(--chain_len)) break;
    i = s->prv[i&SDEFL_WIN_MSK];
  }
}